

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  long *plVar3;
  ulong *iEnd;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  BYTE *pBVar7;
  ZSTD_matchState_t *pZVar8;
  ulong *mEnd;
  BYTE *pBVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  U32 *pUVar13;
  bool bVar14;
  long lVar15;
  U32 UVar16;
  uint uVar17;
  BYTE *op;
  ulong *puVar18;
  size_t sVar19;
  ulong *puVar20;
  long *plVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  int *piVar25;
  ulong *puVar26;
  long *plVar27;
  seqDef *psVar28;
  long *plVar29;
  BYTE *ip;
  int *iStart;
  ulong uVar30;
  ulong uVar31;
  BYTE *pBVar32;
  int iVar33;
  ulong *puVar34;
  ulong uVar35;
  long lVar36;
  U32 UVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  int *piVar41;
  uint uVar42;
  ulong uVar43;
  uint uVar44;
  U32 UVar46;
  U32 UVar47;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  BYTE *base;
  BYTE *dictBase;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *dictStart;
  U32 dictStartIndex;
  U32 *hashSmall;
  U32 *dictHashLong;
  U32 *dictHashSmall;
  long *local_130;
  ulong uVar45;
  
  pBVar7 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = (int *)(pBVar7 + uVar4);
  pZVar8 = ms->dictMatchState;
  uVar5 = (pZVar8->window).dictLimit;
  mEnd = (ulong *)(pZVar8->window).nextSrc;
  pBVar9 = (pZVar8->window).base;
  piVar41 = (int *)(pBVar9 + uVar5);
  uVar44 = ((int)pBVar9 - (int)mEnd) + uVar4;
  uVar45 = (ulong)uVar44;
  iEnd = (ulong *)((long)src + srcSize);
  plVar3 = (long *)((long)src + (srcSize - 8));
  local_130 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)piVar41) + (long)src);
  uVar6 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  pUVar11 = ms->chainTable;
  UVar46 = *rep;
  UVar47 = rep[1];
  pUVar12 = pZVar8->hashTable;
  pUVar13 = pZVar8->chainTable;
  iVar33 = (int)pBVar7;
  if (uVar6 == 5) {
    if (local_130 < plVar3) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      bVar24 = 0x40 - (char)(pZVar8->cParams).hashLog;
      uVar6 = (pZVar8->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar18 = (ulong *)((long)iEnd + -1);
      do {
        lVar36 = *local_130;
        uVar35 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
        uVar43 = (ulong)(lVar36 * -0x30e4432345000000) >> (bVar23 & 0x3f);
        uVar30 = (long)local_130 - (long)pBVar7;
        uVar17 = pUVar10[uVar35];
        uVar31 = (ulong)uVar17;
        UVar16 = (U32)uVar30;
        UVar37 = UVar16 + 1;
        uVar38 = UVar37 - UVar46;
        piVar25 = (int *)(pBVar7 + uVar38);
        if (uVar38 < uVar4) {
          piVar25 = (int *)(pBVar9 + (uVar38 - uVar44));
        }
        uVar39 = pUVar11[uVar43];
        pUVar11[uVar43] = UVar16;
        pUVar10[uVar35] = UVar16;
        if ((uVar38 - uVar4 < 0xfffffffd) && (*piVar25 == *(int *)((long)local_130 + 1))) {
          plVar29 = (long *)((long)local_130 + 1);
          puVar26 = iEnd;
          if (uVar38 < uVar4) {
            puVar26 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)local_130 + 5),(BYTE *)(piVar25 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar26,(BYTE *)iStart);
          uVar31 = (long)plVar29 - (long)src;
          plVar21 = (long *)seqStore->lit;
          plVar27 = (long *)((long)plVar21 + uVar31);
          do {
            *plVar21 = *src;
            plVar21 = plVar21 + 1;
            src = (void *)((long)src + 8);
          } while (plVar21 < plVar27);
          seqStore->lit = seqStore->lit + uVar31;
          if (uVar31 < 0x10000) {
            psVar28 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar28 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar36 = sVar19 + 4;
          uVar35 = sVar19 + 1;
          psVar28->litLength = (U16)uVar31;
          psVar28->offset = 1;
          UVar37 = UVar46;
joined_r0x0013d2c2:
          UVar46 = UVar37;
          if (0xffff < uVar35) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar36 + (long)plVar29);
          psVar28->matchLength = (U16)uVar35;
          seqStore->sequences = psVar28 + 1;
          local_130 = (long *)src;
          if (src <= plVar3) {
            lVar36 = *(long *)(pBVar7 + (uVar30 & 0xffffffff) + 2);
            pUVar11[(ulong)(lVar36 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = UVar16 + 2;
            pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar16 + 2;
            UVar16 = ((int)src + -2) - iVar33;
            lVar36 = *(long *)((long)src + -2);
            pUVar11[(ulong)(lVar36 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = UVar16;
            pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar16;
            do {
              UVar16 = UVar46;
              UVar37 = (int)src - iVar33;
              uVar17 = UVar37 - UVar47;
              pBVar32 = pBVar7;
              if (uVar17 < uVar4) {
                pBVar32 = pBVar9 + -uVar45;
              }
              UVar46 = UVar16;
              local_130 = (long *)src;
              if ((0xfffffffc < uVar17 - uVar4) || (*(int *)(pBVar32 + uVar17) != (int)*src)) break;
              puVar26 = iEnd;
              if (uVar17 < uVar4) {
                puVar26 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar32 + uVar17) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar26,(BYTE *)iStart);
              *(long *)seqStore->lit = *src;
              psVar28 = seqStore->sequences;
              psVar28->litLength = 0;
              psVar28->offset = 1;
              if (0xffff < sVar19 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar28->matchLength = (U16)(sVar19 + 1);
              seqStore->sequences = psVar28 + 1;
              lVar36 = *src;
              pUVar11[(ulong)(lVar36 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = UVar37;
              pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar37;
              src = (void *)((long)src + sVar19 + 4);
              UVar46 = UVar47;
              UVar47 = UVar16;
              local_130 = (long *)src;
            } while (src <= plVar3);
          }
        }
        else {
          plVar29 = local_130;
          if (uVar17 <= uVar4) {
            uVar17 = pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)];
            if ((uVar17 <= uVar5) || (*(long *)(pBVar9 + uVar17) != lVar36)) goto LAB_0013d14c;
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)(local_130 + 1),(BYTE *)((long)(pBVar9 + uVar17) + 8),
                                (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
            lVar36 = sVar19 + 8;
            UVar37 = UVar16 - (uVar44 + uVar17);
            if (src < local_130) {
              piVar25 = (int *)(pBVar9 + ((ulong)uVar17 - 1));
              local_130 = (long *)((long)local_130 + -1);
              while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                lVar36 = lVar36 + 1;
                plVar29 = (long *)((long)local_130 + -1);
                if ((piVar25 <= piVar41) ||
                   (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                   local_130 = plVar29, bVar14)) break;
              }
              goto LAB_0013d6ff;
            }
            goto LAB_0013d702;
          }
          plVar27 = (long *)(pBVar7 + uVar31);
          if (*plVar27 == lVar36) {
            puVar26 = (ulong *)(local_130 + 1);
            puVar34 = (ulong *)(plVar27 + 1);
            puVar20 = puVar26;
            if (puVar26 < puVar1) {
              if (*puVar34 == *puVar26) {
                lVar36 = 0;
                do {
                  puVar34 = (ulong *)((long)local_130 + lVar36 + 0x10);
                  if (puVar1 <= puVar34) {
                    puVar34 = (ulong *)(pBVar7 + lVar36 + uVar31 + 0x10);
                    puVar20 = (ulong *)((long)local_130 + lVar36 + 0x10);
                    goto LAB_0013d4c8;
                  }
                  lVar15 = lVar36 + uVar31 + 0x10;
                  uVar35 = *puVar34;
                  lVar36 = lVar36 + 8;
                } while (*(ulong *)(pBVar7 + lVar15) == uVar35);
                uVar35 = uVar35 ^ *(ulong *)(pBVar7 + lVar15);
                uVar43 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar35 = (uVar43 >> 3 & 0x1fffffff) + lVar36;
              }
              else {
                uVar43 = *puVar26 ^ *puVar34;
                uVar35 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = uVar35 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0013d4c8:
              if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar34 = (ulong *)((long)puVar34 + 4);
              }
              if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar34 = (ulong *)((long)puVar34 + 2);
              }
              if (puVar20 < iEnd) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
              }
              uVar35 = (long)puVar20 - (long)puVar26;
            }
            lVar36 = uVar35 + 8;
            UVar37 = (int)local_130 - (int)plVar27;
            if (local_130 <= src) goto LAB_0013d702;
            piVar25 = (int *)(pBVar7 + (uVar31 - 1));
            local_130 = (long *)((long)local_130 + -1);
            while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
              lVar36 = lVar36 + 1;
              plVar29 = (long *)((long)local_130 + -1);
              if ((piVar25 <= iStart) ||
                 (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                 local_130 = plVar29, bVar14)) break;
            }
            goto LAB_0013d6ff;
          }
LAB_0013d14c:
          if (uVar4 < uVar39) {
            piVar25 = (int *)(pBVar7 + uVar39);
            if (*piVar25 == (int)*local_130) goto LAB_0013d1b7;
          }
          else {
            uVar39 = pUVar13[(ulong)(lVar36 * -0x30e4432345000000) >> (0x40U - (char)uVar6 & 0x3f)];
            if ((uVar5 < uVar39) && (*(int *)(pBVar9 + uVar39) == (int)*local_130)) {
              piVar25 = (int *)(pBVar9 + uVar39);
              uVar39 = uVar39 + uVar44;
LAB_0013d1b7:
              lVar36 = *(long *)((long)local_130 + 1);
              uVar35 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
              plVar29 = (long *)((long)local_130 + 1);
              uVar17 = pUVar10[uVar35];
              uVar31 = (ulong)uVar17;
              pUVar10[uVar35] = UVar37;
              if (uVar17 <= uVar4) {
                uVar17 = pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)];
                if ((uVar17 <= uVar5) || (*(long *)(pBVar9 + uVar17) != lVar36)) goto LAB_0013d3a0;
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_130 + 9),
                                    (BYTE *)((long)(pBVar9 + uVar17) + 8),(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                lVar36 = sVar19 + 8;
                UVar37 = UVar37 - (uVar44 + uVar17);
                if (src < plVar29) {
                  piVar25 = (int *)(pBVar9 + ((ulong)uVar17 - 1));
                  while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                    lVar36 = lVar36 + 1;
                    plVar29 = (long *)((long)local_130 + -1);
                    if ((piVar25 <= piVar41) ||
                       (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                       local_130 = plVar29, bVar14)) break;
                  }
                  goto LAB_0013d6ff;
                }
                goto LAB_0013d702;
              }
              plVar27 = (long *)(pBVar7 + uVar31);
              if (*plVar27 == lVar36) {
                puVar26 = (ulong *)((long)local_130 + 9);
                puVar34 = (ulong *)(plVar27 + 1);
                puVar20 = puVar26;
                if (puVar26 < puVar1) {
                  if (*puVar34 == *puVar26) {
                    lVar36 = 0;
                    do {
                      puVar34 = (ulong *)((long)local_130 + lVar36 + 0x11);
                      if (puVar1 <= puVar34) {
                        puVar34 = (ulong *)(pBVar7 + lVar36 + uVar31 + 0x10);
                        puVar20 = (ulong *)((long)local_130 + lVar36 + 0x11);
                        goto LAB_0013d667;
                      }
                      lVar15 = lVar36 + uVar31 + 0x10;
                      uVar35 = *puVar34;
                      lVar36 = lVar36 + 8;
                    } while (*(ulong *)(pBVar7 + lVar15) == uVar35);
                    uVar35 = uVar35 ^ *(ulong *)(pBVar7 + lVar15);
                    uVar43 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar35 = (uVar43 >> 3 & 0x1fffffff) + lVar36;
                  }
                  else {
                    uVar43 = *puVar26 ^ *puVar34;
                    uVar35 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    uVar35 = uVar35 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0013d667:
                  if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 4);
                    puVar34 = (ulong *)((long)puVar34 + 4);
                  }
                  if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 2);
                    puVar34 = (ulong *)((long)puVar34 + 2);
                  }
                  if (puVar20 < iEnd) {
                    puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
                  }
                  uVar35 = (long)puVar20 - (long)puVar26;
                }
                lVar36 = uVar35 + 8;
                UVar37 = (int)plVar29 - (int)plVar27;
                if (plVar29 <= src) goto LAB_0013d702;
                piVar25 = (int *)(pBVar7 + (uVar31 - 1));
                while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                  lVar36 = lVar36 + 1;
                  plVar29 = (long *)((long)local_130 + -1);
                  if ((piVar25 <= iStart) ||
                     (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                     local_130 = plVar29, bVar14)) break;
                }
LAB_0013d6ff:
                plVar29 = (long *)((long)plVar29 + 1);
              }
              else {
LAB_0013d3a0:
                puVar26 = (ulong *)((long)local_130 + 4);
                puVar34 = (ulong *)(piVar25 + 1);
                if (uVar39 < uVar4) {
                  sVar19 = ZSTD_count_2segments
                                     ((BYTE *)puVar26,(BYTE *)puVar34,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  lVar36 = sVar19 + 4;
                  UVar37 = UVar16 - uVar39;
                  plVar29 = local_130;
                  if ((piVar41 < piVar25) && (src < local_130)) {
                    local_130 = (long *)((long)local_130 + -1);
                    while (piVar25 = (int *)((long)piVar25 + -1), plVar29 = local_130,
                          (char)*local_130 == *(char *)piVar25) {
                      lVar36 = lVar36 + 1;
                      plVar29 = (long *)((long)local_130 + -1);
                      if ((piVar25 <= piVar41) ||
                         (bVar14 = local_130 <= src, local_130 = plVar29, bVar14)) break;
                    }
                    goto LAB_0013d6ff;
                  }
                }
                else {
                  puVar20 = puVar26;
                  if (puVar26 < puVar1) {
                    if (*puVar34 == *puVar26) {
                      lVar36 = 0;
                      do {
                        puVar34 = (ulong *)((long)local_130 + lVar36 + 0xc);
                        if (puVar1 <= puVar34) {
                          puVar34 = (ulong *)((long)piVar25 + lVar36 + 0xc);
                          puVar20 = (ulong *)((long)local_130 + lVar36 + 0xc);
                          goto LAB_0013d5ab;
                        }
                        uVar31 = *(ulong *)((long)piVar25 + lVar36 + 0xc);
                        uVar35 = *puVar34;
                        lVar36 = lVar36 + 8;
                      } while (uVar31 == uVar35);
                      uVar35 = uVar35 ^ uVar31;
                      uVar31 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      uVar31 = (uVar31 >> 3 & 0x1fffffff) + lVar36;
                    }
                    else {
                      uVar35 = *puVar26 ^ *puVar34;
                      uVar31 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      uVar31 = uVar31 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0013d5ab:
                    if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                      puVar20 = (ulong *)((long)puVar20 + 4);
                      puVar34 = (ulong *)((long)puVar34 + 4);
                    }
                    if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                      puVar20 = (ulong *)((long)puVar20 + 2);
                      puVar34 = (ulong *)((long)puVar34 + 2);
                    }
                    if (puVar20 < iEnd) {
                      puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20))
                      ;
                    }
                    uVar31 = (long)puVar20 - (long)puVar26;
                  }
                  lVar36 = uVar31 + 4;
                  UVar37 = (int)local_130 - (int)piVar25;
                  plVar29 = local_130;
                  if ((iStart < piVar25) && (src < local_130)) {
                    local_130 = (long *)((long)local_130 + -1);
                    while (piVar25 = (int *)((long)piVar25 + -1), plVar29 = local_130,
                          (char)*local_130 == *(char *)piVar25) {
                      lVar36 = lVar36 + 1;
                      plVar29 = (long *)((long)local_130 + -1);
                      if ((piVar25 <= iStart) ||
                         (bVar14 = local_130 <= src, local_130 = plVar29, bVar14)) break;
                    }
                    goto LAB_0013d6ff;
                  }
                }
              }
LAB_0013d702:
              uVar31 = (long)plVar29 - (long)src;
              plVar21 = (long *)seqStore->lit;
              plVar27 = (long *)((long)plVar21 + uVar31);
              do {
                *plVar21 = *src;
                plVar21 = plVar21 + 1;
                src = (void *)((long)src + 8);
              } while (plVar21 < plVar27);
              seqStore->lit = seqStore->lit + uVar31;
              if (uVar31 < 0x10000) {
                psVar28 = seqStore->sequences;
              }
              else {
                seqStore->longLengthID = 1;
                psVar28 = seqStore->sequences;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
              }
              uVar35 = lVar36 - 3;
              psVar28->litLength = (U16)uVar31;
              psVar28->offset = UVar37 + 3;
              UVar47 = UVar46;
              goto joined_r0x0013d2c2;
            }
          }
          local_130 = (long *)((long)local_130 + ((long)local_130 - (long)src >> 8) + 1);
        }
      } while (local_130 < plVar3);
    }
  }
  else if (uVar6 == 6) {
    if (local_130 < plVar3) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      bVar24 = 0x40 - (char)(pZVar8->cParams).hashLog;
      uVar6 = (pZVar8->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar18 = (ulong *)((long)iEnd + -1);
      do {
        lVar36 = *local_130;
        uVar35 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
        uVar43 = (ulong)(lVar36 * -0x30e4432340650000) >> (bVar23 & 0x3f);
        uVar30 = (long)local_130 - (long)pBVar7;
        uVar17 = pUVar10[uVar35];
        uVar31 = (ulong)uVar17;
        UVar16 = (U32)uVar30;
        UVar37 = UVar16 + 1;
        uVar38 = UVar37 - UVar46;
        piVar25 = (int *)(pBVar7 + uVar38);
        if (uVar38 < uVar4) {
          piVar25 = (int *)(pBVar9 + (uVar38 - uVar44));
        }
        uVar39 = pUVar11[uVar43];
        pUVar11[uVar43] = UVar16;
        pUVar10[uVar35] = UVar16;
        if ((uVar38 - uVar4 < 0xfffffffd) && (*piVar25 == *(int *)((long)local_130 + 1))) {
          plVar29 = (long *)((long)local_130 + 1);
          puVar26 = iEnd;
          if (uVar38 < uVar4) {
            puVar26 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)local_130 + 5),(BYTE *)(piVar25 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar26,(BYTE *)iStart);
          uVar31 = (long)plVar29 - (long)src;
          plVar21 = (long *)seqStore->lit;
          plVar27 = (long *)((long)plVar21 + uVar31);
          do {
            *plVar21 = *src;
            plVar21 = plVar21 + 1;
            src = (void *)((long)src + 8);
          } while (plVar21 < plVar27);
          seqStore->lit = seqStore->lit + uVar31;
          if (uVar31 < 0x10000) {
            psVar28 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar28 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar36 = sVar19 + 4;
          uVar35 = sVar19 + 1;
          psVar28->litLength = (U16)uVar31;
          psVar28->offset = 1;
joined_r0x0013cbbc:
          if (0xffff < uVar35) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar36 + (long)plVar29);
          psVar28->matchLength = (U16)uVar35;
          seqStore->sequences = psVar28 + 1;
          local_130 = (long *)src;
          if (src <= plVar3) {
            lVar36 = *(long *)(pBVar7 + (uVar30 & 0xffffffff) + 2);
            pUVar11[(ulong)(lVar36 * -0x30e4432340650000) >> (bVar23 & 0x3f)] = UVar16 + 2;
            pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar16 + 2;
            UVar16 = ((int)src + -2) - iVar33;
            lVar36 = *(long *)((long)src + -2);
            pUVar11[(ulong)(lVar36 * -0x30e4432340650000) >> (bVar23 & 0x3f)] = UVar16;
            pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar16;
            do {
              UVar16 = UVar46;
              UVar37 = (int)src - iVar33;
              uVar17 = UVar37 - UVar47;
              pBVar32 = pBVar7;
              if (uVar17 < uVar4) {
                pBVar32 = pBVar9 + -uVar45;
              }
              UVar46 = UVar16;
              local_130 = (long *)src;
              if ((0xfffffffc < uVar17 - uVar4) || (*(int *)(pBVar32 + uVar17) != (int)*src)) break;
              puVar26 = iEnd;
              if (uVar17 < uVar4) {
                puVar26 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar32 + uVar17) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar26,(BYTE *)iStart);
              *(long *)seqStore->lit = *src;
              psVar28 = seqStore->sequences;
              psVar28->litLength = 0;
              psVar28->offset = 1;
              if (0xffff < sVar19 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar28->matchLength = (U16)(sVar19 + 1);
              seqStore->sequences = psVar28 + 1;
              lVar36 = *src;
              pUVar11[(ulong)(lVar36 * -0x30e4432340650000) >> (bVar23 & 0x3f)] = UVar37;
              pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar37;
              src = (void *)((long)src + sVar19 + 4);
              UVar46 = UVar47;
              UVar47 = UVar16;
              local_130 = (long *)src;
            } while (src <= plVar3);
          }
        }
        else {
          plVar29 = local_130;
          if (uVar17 <= uVar4) {
            uVar17 = pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)];
            if ((uVar17 <= uVar5) || (*(long *)(pBVar9 + uVar17) != lVar36)) goto LAB_0013c598;
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)(local_130 + 1),(BYTE *)((long)(pBVar9 + uVar17) + 8),
                                (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
            lVar36 = sVar19 + 8;
            UVar37 = UVar16 - (uVar44 + uVar17);
            if (src < local_130) {
              piVar25 = (int *)(pBVar9 + ((ulong)uVar17 - 1));
              local_130 = (long *)((long)local_130 + -1);
              while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                lVar36 = lVar36 + 1;
                plVar29 = (long *)((long)local_130 + -1);
                if ((piVar25 <= piVar41) ||
                   (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                   local_130 = plVar29, bVar14)) break;
              }
              goto LAB_0013cb4b;
            }
            goto LAB_0013cb4e;
          }
          plVar27 = (long *)(pBVar7 + uVar31);
          if (*plVar27 == lVar36) {
            puVar26 = (ulong *)(local_130 + 1);
            puVar34 = (ulong *)(plVar27 + 1);
            puVar20 = puVar26;
            if (puVar26 < puVar1) {
              if (*puVar34 == *puVar26) {
                lVar36 = 0;
                do {
                  puVar34 = (ulong *)((long)local_130 + lVar36 + 0x10);
                  if (puVar1 <= puVar34) {
                    puVar34 = (ulong *)(pBVar7 + lVar36 + uVar31 + 0x10);
                    puVar20 = (ulong *)((long)local_130 + lVar36 + 0x10);
                    goto LAB_0013c914;
                  }
                  lVar15 = lVar36 + uVar31 + 0x10;
                  uVar35 = *puVar34;
                  lVar36 = lVar36 + 8;
                } while (*(ulong *)(pBVar7 + lVar15) == uVar35);
                uVar35 = uVar35 ^ *(ulong *)(pBVar7 + lVar15);
                uVar43 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar35 = (uVar43 >> 3 & 0x1fffffff) + lVar36;
              }
              else {
                uVar43 = *puVar26 ^ *puVar34;
                uVar35 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = uVar35 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0013c914:
              if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar34 = (ulong *)((long)puVar34 + 4);
              }
              if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar34 = (ulong *)((long)puVar34 + 2);
              }
              if (puVar20 < iEnd) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
              }
              uVar35 = (long)puVar20 - (long)puVar26;
            }
            lVar36 = uVar35 + 8;
            UVar37 = (int)local_130 - (int)plVar27;
            if (local_130 <= src) goto LAB_0013cb4e;
            piVar25 = (int *)(pBVar7 + (uVar31 - 1));
            local_130 = (long *)((long)local_130 + -1);
            while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
              lVar36 = lVar36 + 1;
              plVar29 = (long *)((long)local_130 + -1);
              if ((piVar25 <= iStart) ||
                 (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                 local_130 = plVar29, bVar14)) break;
            }
            goto LAB_0013cb4b;
          }
LAB_0013c598:
          if (uVar4 < uVar39) {
            piVar25 = (int *)(pBVar7 + uVar39);
            if (*piVar25 == (int)*local_130) goto LAB_0013c603;
          }
          else {
            uVar39 = pUVar13[(ulong)(lVar36 * -0x30e4432340650000) >> (0x40U - (char)uVar6 & 0x3f)];
            if ((uVar5 < uVar39) && (*(int *)(pBVar9 + uVar39) == (int)*local_130)) {
              piVar25 = (int *)(pBVar9 + uVar39);
              uVar39 = uVar39 + uVar44;
LAB_0013c603:
              lVar36 = *(long *)((long)local_130 + 1);
              uVar35 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
              plVar29 = (long *)((long)local_130 + 1);
              uVar17 = pUVar10[uVar35];
              uVar31 = (ulong)uVar17;
              pUVar10[uVar35] = UVar37;
              if (uVar17 <= uVar4) {
                uVar17 = pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)];
                if ((uVar17 <= uVar5) || (*(long *)(pBVar9 + uVar17) != lVar36)) goto LAB_0013c7ec;
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_130 + 9),
                                    (BYTE *)((long)(pBVar9 + uVar17) + 8),(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                lVar36 = sVar19 + 8;
                UVar37 = UVar37 - (uVar44 + uVar17);
                if (src < plVar29) {
                  piVar25 = (int *)(pBVar9 + ((ulong)uVar17 - 1));
                  while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                    lVar36 = lVar36 + 1;
                    plVar29 = (long *)((long)local_130 + -1);
                    if ((piVar25 <= piVar41) ||
                       (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                       local_130 = plVar29, bVar14)) break;
                  }
                  goto LAB_0013cb4b;
                }
                goto LAB_0013cb4e;
              }
              plVar27 = (long *)(pBVar7 + uVar31);
              if (*plVar27 == lVar36) {
                puVar26 = (ulong *)((long)local_130 + 9);
                puVar34 = (ulong *)(plVar27 + 1);
                puVar20 = puVar26;
                if (puVar26 < puVar1) {
                  if (*puVar34 == *puVar26) {
                    lVar36 = 0;
                    do {
                      puVar34 = (ulong *)((long)local_130 + lVar36 + 0x11);
                      if (puVar1 <= puVar34) {
                        puVar34 = (ulong *)(pBVar7 + lVar36 + uVar31 + 0x10);
                        puVar20 = (ulong *)((long)local_130 + lVar36 + 0x11);
                        goto LAB_0013cab3;
                      }
                      lVar15 = lVar36 + uVar31 + 0x10;
                      uVar35 = *puVar34;
                      lVar36 = lVar36 + 8;
                    } while (*(ulong *)(pBVar7 + lVar15) == uVar35);
                    uVar35 = uVar35 ^ *(ulong *)(pBVar7 + lVar15);
                    uVar43 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar35 = (uVar43 >> 3 & 0x1fffffff) + lVar36;
                  }
                  else {
                    uVar43 = *puVar26 ^ *puVar34;
                    uVar35 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    uVar35 = uVar35 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0013cab3:
                  if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 4);
                    puVar34 = (ulong *)((long)puVar34 + 4);
                  }
                  if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 2);
                    puVar34 = (ulong *)((long)puVar34 + 2);
                  }
                  if (puVar20 < iEnd) {
                    puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
                  }
                  uVar35 = (long)puVar20 - (long)puVar26;
                }
                lVar36 = uVar35 + 8;
                UVar37 = (int)plVar29 - (int)plVar27;
                if (plVar29 <= src) goto LAB_0013cb4e;
                piVar25 = (int *)(pBVar7 + (uVar31 - 1));
                while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                  lVar36 = lVar36 + 1;
                  plVar29 = (long *)((long)local_130 + -1);
                  if ((piVar25 <= iStart) ||
                     (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                     local_130 = plVar29, bVar14)) break;
                }
LAB_0013cb4b:
                plVar29 = (long *)((long)plVar29 + 1);
              }
              else {
LAB_0013c7ec:
                puVar26 = (ulong *)((long)local_130 + 4);
                puVar34 = (ulong *)(piVar25 + 1);
                if (uVar39 < uVar4) {
                  sVar19 = ZSTD_count_2segments
                                     ((BYTE *)puVar26,(BYTE *)puVar34,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  lVar36 = sVar19 + 4;
                  UVar37 = UVar16 - uVar39;
                  plVar29 = local_130;
                  if ((piVar41 < piVar25) && (src < local_130)) {
                    local_130 = (long *)((long)local_130 + -1);
                    while (piVar25 = (int *)((long)piVar25 + -1), plVar29 = local_130,
                          (char)*local_130 == *(char *)piVar25) {
                      lVar36 = lVar36 + 1;
                      plVar29 = (long *)((long)local_130 + -1);
                      if ((piVar25 <= piVar41) ||
                         (bVar14 = local_130 <= src, local_130 = plVar29, bVar14)) break;
                    }
                    goto LAB_0013cb4b;
                  }
                }
                else {
                  puVar20 = puVar26;
                  if (puVar26 < puVar1) {
                    if (*puVar34 == *puVar26) {
                      lVar36 = 0;
                      do {
                        puVar34 = (ulong *)((long)local_130 + lVar36 + 0xc);
                        if (puVar1 <= puVar34) {
                          puVar34 = (ulong *)((long)piVar25 + lVar36 + 0xc);
                          puVar20 = (ulong *)((long)local_130 + lVar36 + 0xc);
                          goto LAB_0013c9f7;
                        }
                        uVar31 = *(ulong *)((long)piVar25 + lVar36 + 0xc);
                        uVar35 = *puVar34;
                        lVar36 = lVar36 + 8;
                      } while (uVar31 == uVar35);
                      uVar35 = uVar35 ^ uVar31;
                      uVar31 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      uVar31 = (uVar31 >> 3 & 0x1fffffff) + lVar36;
                    }
                    else {
                      uVar35 = *puVar26 ^ *puVar34;
                      uVar31 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      uVar31 = uVar31 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0013c9f7:
                    if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                      puVar20 = (ulong *)((long)puVar20 + 4);
                      puVar34 = (ulong *)((long)puVar34 + 4);
                    }
                    if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                      puVar20 = (ulong *)((long)puVar20 + 2);
                      puVar34 = (ulong *)((long)puVar34 + 2);
                    }
                    if (puVar20 < iEnd) {
                      puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20))
                      ;
                    }
                    uVar31 = (long)puVar20 - (long)puVar26;
                  }
                  lVar36 = uVar31 + 4;
                  UVar37 = (int)local_130 - (int)piVar25;
                  plVar29 = local_130;
                  if ((iStart < piVar25) && (src < local_130)) {
                    local_130 = (long *)((long)local_130 + -1);
                    while (piVar25 = (int *)((long)piVar25 + -1), plVar29 = local_130,
                          (char)*local_130 == *(char *)piVar25) {
                      lVar36 = lVar36 + 1;
                      plVar29 = (long *)((long)local_130 + -1);
                      if ((piVar25 <= iStart) ||
                         (bVar14 = local_130 <= src, local_130 = plVar29, bVar14)) break;
                    }
                    goto LAB_0013cb4b;
                  }
                }
              }
LAB_0013cb4e:
              uVar31 = (long)plVar29 - (long)src;
              plVar21 = (long *)seqStore->lit;
              plVar27 = (long *)((long)plVar21 + uVar31);
              do {
                *plVar21 = *src;
                plVar21 = plVar21 + 1;
                src = (void *)((long)src + 8);
              } while (plVar21 < plVar27);
              seqStore->lit = seqStore->lit + uVar31;
              if (uVar31 < 0x10000) {
                psVar28 = seqStore->sequences;
              }
              else {
                seqStore->longLengthID = 1;
                psVar28 = seqStore->sequences;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
              }
              uVar35 = lVar36 - 3;
              psVar28->litLength = (U16)uVar31;
              psVar28->offset = UVar37 + 3;
              UVar47 = UVar46;
              UVar46 = UVar37;
              goto joined_r0x0013cbbc;
            }
          }
          local_130 = (long *)((long)local_130 + ((long)local_130 - (long)src >> 8) + 1);
        }
      } while (local_130 < plVar3);
    }
  }
  else if (uVar6 == 7) {
    if (local_130 < plVar3) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      bVar24 = 0x40 - (char)(pZVar8->cParams).hashLog;
      uVar6 = (pZVar8->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar18 = (ulong *)((long)iEnd + -1);
      do {
        lVar36 = *local_130;
        uVar35 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
        uVar43 = (ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar23 & 0x3f);
        uVar30 = (long)local_130 - (long)pBVar7;
        uVar17 = pUVar10[uVar35];
        uVar31 = (ulong)uVar17;
        UVar16 = (U32)uVar30;
        UVar37 = UVar16 + 1;
        uVar38 = UVar37 - UVar46;
        piVar25 = (int *)(pBVar7 + uVar38);
        if (uVar38 < uVar4) {
          piVar25 = (int *)(pBVar9 + (uVar38 - uVar44));
        }
        uVar39 = pUVar11[uVar43];
        pUVar11[uVar43] = UVar16;
        pUVar10[uVar35] = UVar16;
        if ((uVar38 - uVar4 < 0xfffffffd) && (*piVar25 == *(int *)((long)local_130 + 1))) {
          plVar29 = (long *)((long)local_130 + 1);
          puVar26 = iEnd;
          if (uVar38 < uVar4) {
            puVar26 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)local_130 + 5),(BYTE *)(piVar25 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar26,(BYTE *)iStart);
          uVar31 = (long)plVar29 - (long)src;
          plVar21 = (long *)seqStore->lit;
          plVar27 = (long *)((long)plVar21 + uVar31);
          do {
            *plVar21 = *src;
            plVar21 = plVar21 + 1;
            src = (void *)((long)src + 8);
          } while (plVar21 < plVar27);
          seqStore->lit = seqStore->lit + uVar31;
          if (uVar31 < 0x10000) {
            psVar28 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar28 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar36 = sVar19 + 4;
          uVar35 = sVar19 + 1;
          psVar28->litLength = (U16)uVar31;
          psVar28->offset = 1;
joined_r0x0013c001:
          if (0xffff < uVar35) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar36 + (long)plVar29);
          psVar28->matchLength = (U16)uVar35;
          seqStore->sequences = psVar28 + 1;
          local_130 = (long *)src;
          if (src <= plVar3) {
            lVar36 = *(long *)(pBVar7 + (uVar30 & 0xffffffff) + 2);
            pUVar11[(ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = UVar16 + 2;
            pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar16 + 2;
            UVar16 = ((int)src + -2) - iVar33;
            lVar36 = *(long *)((long)src + -2);
            pUVar11[(ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = UVar16;
            pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar16;
            do {
              UVar16 = UVar46;
              UVar37 = (int)src - iVar33;
              uVar17 = UVar37 - UVar47;
              pBVar32 = pBVar7;
              if (uVar17 < uVar4) {
                pBVar32 = pBVar9 + -uVar45;
              }
              UVar46 = UVar16;
              local_130 = (long *)src;
              if ((0xfffffffc < uVar17 - uVar4) || (*(int *)(pBVar32 + uVar17) != (int)*src)) break;
              puVar26 = iEnd;
              if (uVar17 < uVar4) {
                puVar26 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar32 + uVar17) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar26,(BYTE *)iStart);
              *(long *)seqStore->lit = *src;
              psVar28 = seqStore->sequences;
              psVar28->litLength = 0;
              psVar28->offset = 1;
              if (0xffff < sVar19 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar28->matchLength = (U16)(sVar19 + 1);
              seqStore->sequences = psVar28 + 1;
              lVar36 = *src;
              pUVar11[(ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = UVar37;
              pUVar10[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar37;
              src = (void *)((long)src + sVar19 + 4);
              UVar46 = UVar47;
              UVar47 = UVar16;
              local_130 = (long *)src;
            } while (src <= plVar3);
          }
        }
        else {
          plVar29 = local_130;
          if (uVar17 <= uVar4) {
            uVar17 = pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)];
            if ((uVar17 <= uVar5) || (*(long *)(pBVar9 + uVar17) != lVar36)) goto LAB_0013b9dd;
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)(local_130 + 1),(BYTE *)((long)(pBVar9 + uVar17) + 8),
                                (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
            lVar36 = sVar19 + 8;
            UVar37 = UVar16 - (uVar44 + uVar17);
            if (src < local_130) {
              piVar25 = (int *)(pBVar9 + ((ulong)uVar17 - 1));
              local_130 = (long *)((long)local_130 + -1);
              while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                lVar36 = lVar36 + 1;
                plVar29 = (long *)((long)local_130 + -1);
                if ((piVar25 <= piVar41) ||
                   (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                   local_130 = plVar29, bVar14)) break;
              }
              goto LAB_0013bf90;
            }
            goto LAB_0013bf93;
          }
          plVar27 = (long *)(pBVar7 + uVar31);
          if (*plVar27 == lVar36) {
            puVar26 = (ulong *)(local_130 + 1);
            puVar34 = (ulong *)(plVar27 + 1);
            puVar20 = puVar26;
            if (puVar26 < puVar1) {
              if (*puVar34 == *puVar26) {
                lVar36 = 0;
                do {
                  puVar34 = (ulong *)((long)local_130 + lVar36 + 0x10);
                  if (puVar1 <= puVar34) {
                    puVar34 = (ulong *)(pBVar7 + lVar36 + uVar31 + 0x10);
                    puVar20 = (ulong *)((long)local_130 + lVar36 + 0x10);
                    goto LAB_0013bd59;
                  }
                  lVar15 = lVar36 + uVar31 + 0x10;
                  uVar35 = *puVar34;
                  lVar36 = lVar36 + 8;
                } while (*(ulong *)(pBVar7 + lVar15) == uVar35);
                uVar35 = uVar35 ^ *(ulong *)(pBVar7 + lVar15);
                uVar43 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                uVar35 = (uVar43 >> 3 & 0x1fffffff) + lVar36;
              }
              else {
                uVar43 = *puVar26 ^ *puVar34;
                uVar35 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                uVar35 = uVar35 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0013bd59:
              if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar34 = (ulong *)((long)puVar34 + 4);
              }
              if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar34 = (ulong *)((long)puVar34 + 2);
              }
              if (puVar20 < iEnd) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
              }
              uVar35 = (long)puVar20 - (long)puVar26;
            }
            lVar36 = uVar35 + 8;
            UVar37 = (int)local_130 - (int)plVar27;
            if (local_130 <= src) goto LAB_0013bf93;
            piVar25 = (int *)(pBVar7 + (uVar31 - 1));
            local_130 = (long *)((long)local_130 + -1);
            while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
              lVar36 = lVar36 + 1;
              plVar29 = (long *)((long)local_130 + -1);
              if ((piVar25 <= iStart) ||
                 (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                 local_130 = plVar29, bVar14)) break;
            }
            goto LAB_0013bf90;
          }
LAB_0013b9dd:
          if (uVar4 < uVar39) {
            piVar25 = (int *)(pBVar7 + uVar39);
            if (*piVar25 == (int)*local_130) goto LAB_0013ba48;
          }
          else {
            uVar39 = pUVar13[(ulong)(lVar36 * -0x30e44323405a9d00) >> (0x40U - (char)uVar6 & 0x3f)];
            if ((uVar5 < uVar39) && (*(int *)(pBVar9 + uVar39) == (int)*local_130)) {
              piVar25 = (int *)(pBVar9 + uVar39);
              uVar39 = uVar39 + uVar44;
LAB_0013ba48:
              lVar36 = *(long *)((long)local_130 + 1);
              uVar35 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
              plVar29 = (long *)((long)local_130 + 1);
              uVar17 = pUVar10[uVar35];
              uVar31 = (ulong)uVar17;
              pUVar10[uVar35] = UVar37;
              if (uVar17 <= uVar4) {
                uVar17 = pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)];
                if ((uVar17 <= uVar5) || (*(long *)(pBVar9 + uVar17) != lVar36)) goto LAB_0013bc31;
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_130 + 9),
                                    (BYTE *)((long)(pBVar9 + uVar17) + 8),(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                lVar36 = sVar19 + 8;
                UVar37 = UVar37 - (uVar44 + uVar17);
                if (src < plVar29) {
                  piVar25 = (int *)(pBVar9 + ((ulong)uVar17 - 1));
                  while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                    lVar36 = lVar36 + 1;
                    plVar29 = (long *)((long)local_130 + -1);
                    if ((piVar25 <= piVar41) ||
                       (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                       local_130 = plVar29, bVar14)) break;
                  }
                  goto LAB_0013bf90;
                }
                goto LAB_0013bf93;
              }
              plVar27 = (long *)(pBVar7 + uVar31);
              if (*plVar27 == lVar36) {
                puVar26 = (ulong *)((long)local_130 + 9);
                puVar34 = (ulong *)(plVar27 + 1);
                puVar20 = puVar26;
                if (puVar26 < puVar1) {
                  if (*puVar34 == *puVar26) {
                    lVar36 = 0;
                    do {
                      puVar34 = (ulong *)((long)local_130 + lVar36 + 0x11);
                      if (puVar1 <= puVar34) {
                        puVar34 = (ulong *)(pBVar7 + lVar36 + uVar31 + 0x10);
                        puVar20 = (ulong *)((long)local_130 + lVar36 + 0x11);
                        goto LAB_0013bef8;
                      }
                      lVar15 = lVar36 + uVar31 + 0x10;
                      uVar35 = *puVar34;
                      lVar36 = lVar36 + 8;
                    } while (*(ulong *)(pBVar7 + lVar15) == uVar35);
                    uVar35 = uVar35 ^ *(ulong *)(pBVar7 + lVar15);
                    uVar43 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    uVar35 = (uVar43 >> 3 & 0x1fffffff) + lVar36;
                  }
                  else {
                    uVar43 = *puVar26 ^ *puVar34;
                    uVar35 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    uVar35 = uVar35 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0013bef8:
                  if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 4);
                    puVar34 = (ulong *)((long)puVar34 + 4);
                  }
                  if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 2);
                    puVar34 = (ulong *)((long)puVar34 + 2);
                  }
                  if (puVar20 < iEnd) {
                    puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
                  }
                  uVar35 = (long)puVar20 - (long)puVar26;
                }
                lVar36 = uVar35 + 8;
                UVar37 = (int)plVar29 - (int)plVar27;
                if (plVar29 <= src) goto LAB_0013bf93;
                piVar25 = (int *)(pBVar7 + (uVar31 - 1));
                while (plVar29 = local_130, (char)*local_130 == (char)*piVar25) {
                  lVar36 = lVar36 + 1;
                  plVar29 = (long *)((long)local_130 + -1);
                  if ((piVar25 <= iStart) ||
                     (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                     local_130 = plVar29, bVar14)) break;
                }
LAB_0013bf90:
                plVar29 = (long *)((long)plVar29 + 1);
              }
              else {
LAB_0013bc31:
                puVar26 = (ulong *)((long)local_130 + 4);
                puVar34 = (ulong *)(piVar25 + 1);
                if (uVar39 < uVar4) {
                  sVar19 = ZSTD_count_2segments
                                     ((BYTE *)puVar26,(BYTE *)puVar34,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  lVar36 = sVar19 + 4;
                  UVar37 = UVar16 - uVar39;
                  plVar29 = local_130;
                  if ((piVar41 < piVar25) && (src < local_130)) {
                    local_130 = (long *)((long)local_130 + -1);
                    while (piVar25 = (int *)((long)piVar25 + -1), plVar29 = local_130,
                          (char)*local_130 == *(char *)piVar25) {
                      lVar36 = lVar36 + 1;
                      plVar29 = (long *)((long)local_130 + -1);
                      if ((piVar25 <= piVar41) ||
                         (bVar14 = local_130 <= src, local_130 = plVar29, bVar14)) break;
                    }
                    goto LAB_0013bf90;
                  }
                }
                else {
                  puVar20 = puVar26;
                  if (puVar26 < puVar1) {
                    if (*puVar34 == *puVar26) {
                      lVar36 = 0;
                      do {
                        puVar34 = (ulong *)((long)local_130 + lVar36 + 0xc);
                        if (puVar1 <= puVar34) {
                          puVar34 = (ulong *)((long)piVar25 + lVar36 + 0xc);
                          puVar20 = (ulong *)((long)local_130 + lVar36 + 0xc);
                          goto LAB_0013be3c;
                        }
                        uVar31 = *(ulong *)((long)piVar25 + lVar36 + 0xc);
                        uVar35 = *puVar34;
                        lVar36 = lVar36 + 8;
                      } while (uVar31 == uVar35);
                      uVar35 = uVar35 ^ uVar31;
                      uVar31 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      uVar31 = (uVar31 >> 3 & 0x1fffffff) + lVar36;
                    }
                    else {
                      uVar35 = *puVar26 ^ *puVar34;
                      uVar31 = 0;
                      if (uVar35 != 0) {
                        for (; (uVar35 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      uVar31 = uVar31 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_0013be3c:
                    if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                      puVar20 = (ulong *)((long)puVar20 + 4);
                      puVar34 = (ulong *)((long)puVar34 + 4);
                    }
                    if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                      puVar20 = (ulong *)((long)puVar20 + 2);
                      puVar34 = (ulong *)((long)puVar34 + 2);
                    }
                    if (puVar20 < iEnd) {
                      puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20))
                      ;
                    }
                    uVar31 = (long)puVar20 - (long)puVar26;
                  }
                  lVar36 = uVar31 + 4;
                  UVar37 = (int)local_130 - (int)piVar25;
                  plVar29 = local_130;
                  if ((iStart < piVar25) && (src < local_130)) {
                    local_130 = (long *)((long)local_130 + -1);
                    while (piVar25 = (int *)((long)piVar25 + -1), plVar29 = local_130,
                          (char)*local_130 == *(char *)piVar25) {
                      lVar36 = lVar36 + 1;
                      plVar29 = (long *)((long)local_130 + -1);
                      if ((piVar25 <= iStart) ||
                         (bVar14 = local_130 <= src, local_130 = plVar29, bVar14)) break;
                    }
                    goto LAB_0013bf90;
                  }
                }
              }
LAB_0013bf93:
              uVar31 = (long)plVar29 - (long)src;
              plVar21 = (long *)seqStore->lit;
              plVar27 = (long *)((long)plVar21 + uVar31);
              do {
                *plVar21 = *src;
                plVar21 = plVar21 + 1;
                src = (void *)((long)src + 8);
              } while (plVar21 < plVar27);
              seqStore->lit = seqStore->lit + uVar31;
              if (uVar31 < 0x10000) {
                psVar28 = seqStore->sequences;
              }
              else {
                seqStore->longLengthID = 1;
                psVar28 = seqStore->sequences;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
              }
              uVar35 = lVar36 - 3;
              psVar28->litLength = (U16)uVar31;
              psVar28->offset = UVar37 + 3;
              UVar47 = UVar46;
              UVar46 = UVar37;
              goto joined_r0x0013c001;
            }
          }
          local_130 = (long *)((long)local_130 + ((long)local_130 - (long)src >> 8) + 1);
        }
      } while (local_130 < plVar3);
    }
  }
  else if (local_130 < plVar3) {
    bVar22 = 0x40 - (char)(ms->cParams).hashLog;
    bVar23 = 0x20 - (char)(ms->cParams).chainLog;
    bVar24 = 0x40 - (char)(pZVar8->cParams).hashLog;
    uVar6 = (pZVar8->cParams).chainLog;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar18 = (ulong *)((long)iEnd + -1);
    do {
      uVar38 = (int)*local_130 * -0x61c8864f;
      uVar35 = *local_130 * -0x30e44323485a9b9d;
      uVar43 = uVar35 >> (bVar22 & 0x3f);
      uVar39 = uVar38 >> (bVar23 & 0x1f);
      uVar31 = (long)local_130 - (long)pBVar7;
      uVar17 = pUVar10[uVar43];
      uVar30 = (ulong)uVar17;
      UVar16 = (U32)uVar31;
      UVar37 = UVar16 + 1;
      uVar40 = UVar37 - UVar46;
      piVar25 = (int *)(pBVar7 + uVar40);
      if (uVar40 < uVar4) {
        piVar25 = (int *)(pBVar9 + (uVar40 - uVar44));
      }
      uVar42 = pUVar11[uVar39];
      pUVar11[uVar39] = UVar16;
      pUVar10[uVar43] = UVar16;
      if ((uVar40 - uVar4 < 0xfffffffd) && (*piVar25 == *(int *)((long)local_130 + 1))) {
        plVar29 = (long *)((long)local_130 + 1);
        puVar26 = iEnd;
        if (uVar40 < uVar4) {
          puVar26 = mEnd;
        }
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)((long)local_130 + 5),(BYTE *)(piVar25 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar26,(BYTE *)iStart);
        uVar30 = (long)plVar29 - (long)src;
        plVar21 = (long *)seqStore->lit;
        plVar27 = (long *)((long)plVar21 + uVar30);
        do {
          *plVar21 = *src;
          plVar21 = plVar21 + 1;
          src = (void *)((long)src + 8);
        } while (plVar21 < plVar27);
        seqStore->lit = seqStore->lit + uVar30;
        if (uVar30 < 0x10000) {
          psVar28 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar28 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar36 = sVar19 + 4;
        uVar35 = sVar19 + 1;
        psVar28->litLength = (U16)uVar30;
        psVar28->offset = 1;
joined_r0x0013e25b:
        if (0xffff < uVar35) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        src = (void *)(lVar36 + (long)plVar29);
        psVar28->matchLength = (U16)uVar35;
        seqStore->sequences = psVar28 + 1;
        local_130 = (long *)src;
        if (src <= plVar3) {
          uVar31 = uVar31 & 0xffffffff;
          pUVar11[(uint)(*(int *)(pBVar7 + uVar31 + 2) * -0x61c8864f) >> (bVar23 & 0x1f)] =
               UVar16 + 2;
          pUVar10[(ulong)(*(long *)(pBVar7 + uVar31 + 2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)]
               = UVar16 + 2;
          UVar16 = ((int)src + -2) - iVar33;
          pUVar11[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar16;
          pUVar10[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
               UVar16;
          do {
            UVar16 = UVar46;
            UVar37 = (int)src - iVar33;
            uVar17 = UVar37 - UVar47;
            pBVar32 = pBVar7;
            if (uVar17 < uVar4) {
              pBVar32 = pBVar9 + -uVar45;
            }
            UVar46 = UVar16;
            local_130 = (long *)src;
            if ((0xfffffffc < uVar17 - uVar4) || (*(int *)(pBVar32 + uVar17) != (int)*src)) break;
            puVar26 = iEnd;
            if (uVar17 < uVar4) {
              puVar26 = mEnd;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar32 + uVar17) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar26,(BYTE *)iStart);
            *(long *)seqStore->lit = *src;
            psVar28 = seqStore->sequences;
            psVar28->litLength = 0;
            psVar28->offset = 1;
            if (0xffff < sVar19 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar28->matchLength = (U16)(sVar19 + 1);
            seqStore->sequences = psVar28 + 1;
            pUVar11[(uint)((int)*src * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar37;
            pUVar10[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = UVar37;
            src = (void *)((long)src + sVar19 + 4);
            UVar46 = UVar47;
            UVar47 = UVar16;
            local_130 = (long *)src;
          } while (src <= plVar3);
        }
      }
      else {
        plVar29 = local_130;
        if (uVar17 <= uVar4) {
          uVar17 = pUVar12[uVar35 >> (bVar24 & 0x3f)];
          if ((uVar17 <= uVar5) || (*(long *)(pBVar9 + uVar17) != *local_130)) goto LAB_0013dcd9;
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)(local_130 + 1),(BYTE *)((long)(pBVar9 + uVar17) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          lVar36 = sVar19 + 8;
          UVar37 = UVar16 - (uVar44 + uVar17);
          if (src < local_130) {
            piVar25 = (int *)(pBVar9 + ((ulong)uVar17 - 1));
            plVar29 = (long *)((long)local_130 + -1);
            while (plVar27 = plVar29, (char)*plVar29 == (char)*piVar25) {
              lVar36 = lVar36 + 1;
              plVar27 = (long *)((long)plVar29 + -1);
              if ((piVar25 <= piVar41) ||
                 (piVar25 = (int *)((long)piVar25 + -1), bVar14 = plVar29 <= src, plVar29 = plVar27,
                 bVar14)) break;
            }
            goto LAB_0013e1ec;
          }
          goto LAB_0013e1ef;
        }
        plVar27 = (long *)(pBVar7 + uVar30);
        if (*plVar27 == *local_130) {
          puVar26 = (ulong *)(local_130 + 1);
          puVar34 = (ulong *)(plVar27 + 1);
          puVar20 = puVar26;
          if (puVar26 < puVar1) {
            if (*puVar34 == *puVar26) {
              lVar36 = 0;
              do {
                puVar34 = (ulong *)((long)local_130 + lVar36 + 0x10);
                if (puVar1 <= puVar34) {
                  puVar34 = (ulong *)(pBVar7 + lVar36 + uVar30 + 0x10);
                  puVar20 = (ulong *)((long)local_130 + lVar36 + 0x10);
                  goto LAB_0013dffc;
                }
                lVar15 = lVar36 + uVar30 + 0x10;
                uVar35 = *puVar34;
                lVar36 = lVar36 + 8;
              } while (*(ulong *)(pBVar7 + lVar15) == uVar35);
              uVar35 = uVar35 ^ *(ulong *)(pBVar7 + lVar15);
              uVar43 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar35 = (uVar43 >> 3 & 0x1fffffff) + lVar36;
            }
            else {
              uVar43 = *puVar26 ^ *puVar34;
              uVar35 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar35 = uVar35 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0013dffc:
            if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar34 = (ulong *)((long)puVar34 + 4);
            }
            if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar34 = (ulong *)((long)puVar34 + 2);
            }
            if (puVar20 < iEnd) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
            }
            uVar35 = (long)puVar20 - (long)puVar26;
          }
          lVar36 = uVar35 + 8;
          UVar37 = (int)local_130 - (int)plVar27;
          if (local_130 <= src) goto LAB_0013e1ef;
          piVar25 = (int *)(pBVar7 + (uVar30 - 1));
          plVar29 = (long *)((long)local_130 + -1);
          while (plVar27 = plVar29, (char)*plVar29 == (char)*piVar25) {
            lVar36 = lVar36 + 1;
            plVar27 = (long *)((long)plVar29 + -1);
            if ((piVar25 <= iStart) ||
               (piVar25 = (int *)((long)piVar25 + -1), bVar14 = plVar29 <= src, plVar29 = plVar27,
               bVar14)) break;
          }
          goto LAB_0013e1ec;
        }
LAB_0013dcd9:
        if (uVar4 < uVar42) {
          piVar25 = (int *)(pBVar7 + uVar42);
          if (*piVar25 == (int)*local_130) goto LAB_0013dd37;
        }
        else {
          uVar42 = pUVar13[uVar38 >> (0x20U - (char)uVar6 & 0x1f)];
          if ((uVar5 < uVar42) && (*(int *)(pBVar9 + uVar42) == (int)*local_130)) {
            piVar25 = (int *)(pBVar9 + uVar42);
            uVar42 = uVar42 + uVar44;
LAB_0013dd37:
            lVar36 = *(long *)((long)local_130 + 1);
            uVar35 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f);
            plVar29 = (long *)((long)local_130 + 1);
            uVar17 = pUVar10[uVar35];
            uVar30 = (ulong)uVar17;
            pUVar10[uVar35] = UVar37;
            if (uVar17 <= uVar4) {
              uVar17 = pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar24 & 0x3f)];
              if ((uVar17 <= uVar5) || (*(long *)(pBVar9 + uVar17) != lVar36)) goto LAB_0013def1;
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_130 + 9),
                                  (BYTE *)((long)(pBVar9 + uVar17) + 8),(BYTE *)iEnd,(BYTE *)mEnd,
                                  (BYTE *)iStart);
              lVar36 = sVar19 + 8;
              UVar37 = UVar37 - (uVar44 + uVar17);
              if (src < plVar29) {
                piVar25 = (int *)(pBVar9 + ((ulong)uVar17 - 1));
                while (plVar27 = local_130, (char)*local_130 == (char)*piVar25) {
                  lVar36 = lVar36 + 1;
                  plVar27 = (long *)((long)local_130 + -1);
                  if ((piVar25 <= piVar41) ||
                     (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                     local_130 = plVar27, bVar14)) break;
                }
                goto LAB_0013e1ec;
              }
              goto LAB_0013e1ef;
            }
            plVar27 = (long *)(pBVar7 + uVar30);
            if (*plVar27 == lVar36) {
              puVar26 = (ulong *)((long)local_130 + 9);
              puVar34 = (ulong *)(plVar27 + 1);
              puVar20 = puVar26;
              if (puVar26 < puVar1) {
                if (*puVar34 == *puVar26) {
                  lVar36 = 0;
                  do {
                    puVar34 = (ulong *)((long)local_130 + lVar36 + 0x11);
                    if (puVar1 <= puVar34) {
                      puVar34 = (ulong *)(pBVar7 + lVar36 + uVar30 + 0x10);
                      puVar20 = (ulong *)((long)local_130 + lVar36 + 0x11);
                      goto LAB_0013e167;
                    }
                    lVar15 = lVar36 + uVar30 + 0x10;
                    uVar35 = *puVar34;
                    lVar36 = lVar36 + 8;
                  } while (*(ulong *)(pBVar7 + lVar15) == uVar35);
                  uVar35 = uVar35 ^ *(ulong *)(pBVar7 + lVar15);
                  uVar43 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                    }
                  }
                  uVar35 = (uVar43 >> 3 & 0x1fffffff) + lVar36;
                }
                else {
                  uVar43 = *puVar26 ^ *puVar34;
                  uVar35 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                  uVar35 = uVar35 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0013e167:
                if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                  puVar20 = (ulong *)((long)puVar20 + 4);
                  puVar34 = (ulong *)((long)puVar34 + 4);
                }
                if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                  puVar20 = (ulong *)((long)puVar20 + 2);
                  puVar34 = (ulong *)((long)puVar34 + 2);
                }
                if (puVar20 < iEnd) {
                  puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
                }
                uVar35 = (long)puVar20 - (long)puVar26;
              }
              lVar36 = uVar35 + 8;
              UVar37 = (int)plVar29 - (int)plVar27;
              if (plVar29 <= src) goto LAB_0013e1ef;
              piVar25 = (int *)(pBVar7 + (uVar30 - 1));
              while (plVar27 = local_130, (char)*local_130 == (char)*piVar25) {
                lVar36 = lVar36 + 1;
                plVar27 = (long *)((long)local_130 + -1);
                if ((piVar25 <= iStart) ||
                   (piVar25 = (int *)((long)piVar25 + -1), bVar14 = local_130 <= src,
                   local_130 = plVar27, bVar14)) break;
              }
LAB_0013e1ec:
              plVar29 = (long *)((long)plVar27 + 1);
            }
            else {
LAB_0013def1:
              puVar26 = (ulong *)((long)local_130 + 4);
              puVar34 = (ulong *)(piVar25 + 1);
              if (uVar42 < uVar4) {
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)puVar26,(BYTE *)puVar34,(BYTE *)iEnd,(BYTE *)mEnd,
                                    (BYTE *)iStart);
                lVar36 = sVar19 + 4;
                UVar37 = UVar16 - uVar42;
                plVar29 = local_130;
                if ((piVar41 < piVar25) && (src < local_130)) {
                  plVar29 = (long *)((long)local_130 + -1);
                  while (piVar25 = (int *)((long)piVar25 + -1), plVar27 = plVar29,
                        (char)*plVar29 == *(char *)piVar25) {
                    lVar36 = lVar36 + 1;
                    plVar27 = (long *)((long)plVar29 + -1);
                    if ((piVar25 <= piVar41) || (bVar14 = plVar29 <= src, plVar29 = plVar27, bVar14)
                       ) break;
                  }
                  goto LAB_0013e1ec;
                }
              }
              else {
                puVar20 = puVar26;
                if (puVar26 < puVar1) {
                  if (*puVar34 == *puVar26) {
                    lVar36 = 0;
                    do {
                      puVar34 = (ulong *)((long)local_130 + lVar36 + 0xc);
                      if (puVar1 <= puVar34) {
                        puVar34 = (ulong *)((long)piVar25 + lVar36 + 0xc);
                        puVar20 = (ulong *)((long)local_130 + lVar36 + 0xc);
                        goto LAB_0013e0cb;
                      }
                      uVar30 = *(ulong *)((long)piVar25 + lVar36 + 0xc);
                      uVar35 = *puVar34;
                      lVar36 = lVar36 + 8;
                    } while (uVar30 == uVar35);
                    uVar35 = uVar35 ^ uVar30;
                    uVar30 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                      }
                    }
                    uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar36;
                  }
                  else {
                    uVar35 = *puVar26 ^ *puVar34;
                    uVar30 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                      }
                    }
                    uVar30 = uVar30 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0013e0cb:
                  if ((puVar20 < puVar2) && ((int)*puVar34 == (int)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 4);
                    puVar34 = (ulong *)((long)puVar34 + 4);
                  }
                  if ((puVar20 < puVar18) && ((short)*puVar34 == (short)*puVar20)) {
                    puVar20 = (ulong *)((long)puVar20 + 2);
                    puVar34 = (ulong *)((long)puVar34 + 2);
                  }
                  if (puVar20 < iEnd) {
                    puVar20 = (ulong *)((long)puVar20 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar20));
                  }
                  uVar30 = (long)puVar20 - (long)puVar26;
                }
                lVar36 = uVar30 + 4;
                UVar37 = (int)local_130 - (int)piVar25;
                plVar29 = local_130;
                if ((iStart < piVar25) && (src < local_130)) {
                  plVar29 = (long *)((long)local_130 + -1);
                  while (piVar25 = (int *)((long)piVar25 + -1), plVar27 = plVar29,
                        (char)*plVar29 == *(char *)piVar25) {
                    lVar36 = lVar36 + 1;
                    plVar27 = (long *)((long)plVar29 + -1);
                    if ((piVar25 <= iStart) || (bVar14 = plVar29 <= src, plVar29 = plVar27, bVar14))
                    break;
                  }
                  goto LAB_0013e1ec;
                }
              }
            }
LAB_0013e1ef:
            uVar30 = (long)plVar29 - (long)src;
            plVar21 = (long *)seqStore->lit;
            plVar27 = (long *)((long)plVar21 + uVar30);
            do {
              *plVar21 = *src;
              plVar21 = plVar21 + 1;
              src = (void *)((long)src + 8);
            } while (plVar21 < plVar27);
            seqStore->lit = seqStore->lit + uVar30;
            if (uVar30 < 0x10000) {
              psVar28 = seqStore->sequences;
            }
            else {
              seqStore->longLengthID = 1;
              psVar28 = seqStore->sequences;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
            }
            uVar35 = lVar36 - 3;
            psVar28->litLength = (U16)uVar30;
            psVar28->offset = UVar37 + 3;
            UVar47 = UVar46;
            UVar46 = UVar37;
            goto joined_r0x0013e25b;
          }
        }
        local_130 = (long *)((long)local_130 + ((long)local_130 - (long)src >> 8) + 1);
      }
    } while (local_130 < plVar3);
  }
  *rep = UVar46;
  rep[1] = UVar47;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}